

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void read_config_file(fnchar *filename)

{
  byte *pbVar1;
  FILE *__stream;
  long lVar2;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  ushort *puVar7;
  byte *pbVar8;
  size_t __size;
  byte *pbVar9;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  fseek(__stream,0,2);
  lVar2 = ftell(__stream);
  rewind(__stream);
  if ((int)lVar2 != 0) {
    __s = (char *)malloc((lVar2 << 0x20) + 0x100000000 >> 0x20);
    if (__s != (char *)0x0) {
      __size = (lVar2 << 0x20) >> 0x20;
      fread(__s,__size,1,__stream);
      fclose(__stream);
      __s[__size] = '\0';
      pcVar3 = strtok(__s,"\n");
      do {
        pcVar4 = strchr(pcVar3,0x23);
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
        pbVar5 = (byte *)strchr(pcVar3,0x3d);
        if (pbVar5 != (byte *)0x0) {
          *pbVar5 = 0;
          ppuVar6 = __ctype_b_loc();
          puVar7 = *ppuVar6;
          pcVar3 = pcVar3 + -1;
          do {
            pbVar1 = (byte *)(pcVar3 + 1);
            pcVar3 = pcVar3 + 1;
            pbVar8 = pbVar5;
          } while ((*(byte *)((long)puVar7 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
          while (pbVar8 = pbVar8 + -1,
                (*(byte *)((long)puVar7 + (ulong)*pbVar8 * 2 + 1) & 0x20) != 0) {
            *pbVar8 = 0;
            puVar7 = *ppuVar6;
          }
          pbVar1 = pbVar5;
          do {
            pbVar9 = pbVar1;
            pbVar8 = pbVar5 + 1;
            pbVar1 = pbVar9 + 1;
          } while (pbVar9[1] != 0);
          do {
            pbVar5 = pbVar8;
            pbVar8 = pbVar5 + 1;
          } while ((*(byte *)((long)puVar7 + (ulong)*pbVar5 * 2 + 1) & 0x20) != 0);
          while ((*(byte *)((long)puVar7 + (ulong)*pbVar9 * 2 + 1) & 0x20) != 0) {
            *pbVar9 = 0;
            pbVar9 = pbVar9 + -1;
            puVar7 = *ppuVar6;
          }
          if ((*pbVar9 == 0x22) && (*pbVar5 == 0x22)) {
            *pbVar9 = 0;
            pbVar5 = pbVar5 + 1;
          }
          nh_set_option(pcVar3,pbVar5,1);
        }
        pcVar3 = strtok((char *)0x0,"\n");
      } while (pcVar3 != (char *)0x0);
      free(__s);
      return;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

static void read_config_file(const fnchar *filename)
{
    FILE *fp;
    int fsize;
    char *buf, *line;
    
    fp = fopen(filename, "rb");
    if (!fp)
	return;

    /* obtain file size. */
    fseek(fp , 0 , SEEK_END);
    fsize = ftell(fp);
    rewind(fp);
    
    if (!fsize) {/* truncated config file */
	fclose(fp);
	return;
    }

    buf = malloc(fsize+1);
    if (!buf) {
	fclose(fp);
	return;
    }

    fread(buf, fsize, 1, fp);
    fclose(fp);
    
    buf[fsize] = '\0';
    
    /* each option is expected to have the following format:
	* name=value\n
	*/
    line = strtok(buf, "\n");
    do {
	read_config_line(line);
	
	line = strtok(NULL, "\n");
    } while (line);
    
    free(buf);
}